

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_tests.cpp
# Opt level: O3

void (anonymous_namespace)::test_concat<true,5>(uint32_t sz)

{
  int val;
  const_reference piVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint32_t j;
  size_type_conflict index;
  vector<int,_true,_5> v2;
  vector<int,_true,_5> v1;
  vector<int,_true,_5> catted;
  vector<int,_true,_5> local_60;
  vector<int,_true,_5> local_58;
  vector<int,_true,_5> local_50;
  ref<immutable::rrb<int,_true,_5>_> local_48;
  uint local_3c;
  uint local_38;
  int local_34;
  
  immutable::vector<int,_true,_5>::vector(&local_58);
  immutable::vector<int,_true,_5>::vector(&local_60);
  local_3c = sz;
  if (sz != 0) {
    iVar2 = 2;
    iVar4 = -1;
    uVar3 = 0;
    do {
      local_34 = iVar2;
      rand();
      immutable::vector<int,_true,_5>::push_back(&local_50,(value_type_conflict)&local_58);
      local_48 = local_58._impl.ptr;
      if (local_50._impl.ptr != (rrb<int,_true,_5> *)0x0) {
        LOCK();
        (((atomic<unsigned_int> *)((long)local_50._impl.ptr + 0x20))->
        super___atomic_base<unsigned_int>)._M_i =
             (((atomic<unsigned_int> *)((long)local_50._impl.ptr + 0x20))->
             super___atomic_base<unsigned_int>)._M_i + 1;
        UNLOCK();
      }
      local_58._impl.ptr = local_50._impl.ptr;
      immutable::ref<immutable::rrb<int,_true,_5>_>::~ref(&local_48);
      immutable::ref<immutable::rrb<int,_true,_5>_>::~ref(&local_50._impl);
      rand();
      immutable::vector<int,_true,_5>::push_back(&local_50,(value_type_conflict)&local_60);
      local_48 = local_60._impl.ptr;
      if (local_50._impl.ptr != (rrb<int,_true,_5> *)0x0) {
        LOCK();
        (((atomic<unsigned_int> *)((long)local_50._impl.ptr + 0x20))->
        super___atomic_base<unsigned_int>)._M_i =
             (((atomic<unsigned_int> *)((long)local_50._impl.ptr + 0x20))->
             super___atomic_base<unsigned_int>)._M_i + 1;
        UNLOCK();
      }
      local_60._impl.ptr = local_50._impl.ptr;
      immutable::ref<immutable::rrb<int,_true,_5>_>::~ref(&local_48);
      immutable::ref<immutable::rrb<int,_true,_5>_>::~ref(&local_50._impl);
      immutable::operator+((immutable *)&local_48,&local_58,&local_60);
      local_38 = uVar3 + 1;
      index = 0;
      do {
        piVar1 = immutable::vector<int,_true,_5>::operator[]
                           ((vector<int,_true,_5> *)&local_48,index);
        val = *piVar1;
        if (uVar3 < index) {
          piVar1 = immutable::vector<int,_true,_5>::operator[](&local_60,index + iVar4);
          TestEq<int,int>(*piVar1,val,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                          ,0x123,
                          "void (anonymous namespace)::test_concat(uint32_t) [atomic_ref_counting = true, N = 5]"
                         );
        }
        else {
          piVar1 = immutable::vector<int,_true,_5>::operator[](&local_58,index);
          TestEq<int,int>(*piVar1,val,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                          ,0x11e,
                          "void (anonymous namespace)::test_concat(uint32_t) [atomic_ref_counting = true, N = 5]"
                         );
        }
        index = index + 1;
      } while (iVar2 + (uint)(iVar2 == 0) != index);
      immutable::ref<immutable::rrb<int,_true,_5>_>::~ref(&local_48);
      iVar2 = local_34 + 2;
      iVar4 = iVar4 + -1;
      uVar3 = local_38;
    } while (local_38 != local_3c);
  }
  immutable::ref<immutable::rrb<int,_true,_5>_>::~ref(&local_60._impl);
  immutable::ref<immutable::rrb<int,_true,_5>_>::~ref(&local_58._impl);
  return;
}

Assistant:

void test_concat(uint32_t sz = 2000)
    {
    immutable::vector<int, atomic_ref_counting, N> v1;
    immutable::vector<int, atomic_ref_counting, N> v2;
    for (uint32_t i = 0; i < sz; ++i)
      {
      v1 = v1.push_back((int)rand());
      v2 = v2.push_back((int)rand());

      immutable::vector<int, atomic_ref_counting, N> catted = v1 + v2;

      for (uint32_t j = 0; j < (i + 1) * 2; j++)
        {
        int val_cat = catted[j];
        if (j <= i)
          {
          int val1 = v1[j];
          TEST_EQ(val1, val_cat);
          }
        else
          {
          int val2 = v2[j - i - 1];
          TEST_EQ(val2, val_cat);
          }
        }
      }
    }